

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MIL.pb.cc
# Opt level: O1

void __thiscall CoreML::Specification::MILSpec::ListType::SharedDtor(ListType *this)

{
  ulong uVar1;
  ValueType *this_00;
  Dimension *this_01;
  LogMessage *other;
  undefined8 *puVar2;
  LogFinisher local_51;
  LogMessage local_50;
  
  uVar1 = (this->super_MessageLite)._internal_metadata_.ptr_;
  puVar2 = (undefined8 *)(uVar1 & 0xfffffffffffffffc);
  if ((uVar1 & 1) != 0) {
    puVar2 = (undefined8 *)*puVar2;
  }
  if (puVar2 != (undefined8 *)0x0) {
    google::protobuf::internal::LogMessage::LogMessage
              (&local_50,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/build_O1/mlmodel/format/MIL.pb.cc"
               ,0xf40);
    other = google::protobuf::internal::LogMessage::operator<<
                      (&local_50,"CHECK failed: GetArenaForAllocation() == nullptr: ");
    google::protobuf::internal::LogFinisher::operator=(&local_51,other);
    google::protobuf::internal::LogMessage::~LogMessage(&local_50);
  }
  if (this != (ListType *)_ListType_default_instance_) {
    this_00 = this->type_;
    if (this_00 != (ValueType *)0x0) {
      ValueType::~ValueType(this_00);
      operator_delete(this_00,0x20);
    }
    if ((this != (ListType *)_ListType_default_instance_) &&
       (this_01 = this->length_, this_01 != (Dimension *)0x0)) {
      Dimension::~Dimension(this_01);
      operator_delete(this_01,0x20);
    }
  }
  return;
}

Assistant:

inline void ListType::SharedDtor() {
  GOOGLE_DCHECK(GetArenaForAllocation() == nullptr);
  if (this != internal_default_instance()) delete type_;
  if (this != internal_default_instance()) delete length_;
}